

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::interpretPushThisContext(StackInterpreter *this)

{
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar1;
  StackInterpreter *this_local;
  
  fetchNextInstructionOpcode(this);
  StackMemory::ensureFrameIsMarried(this->stack);
  paVar1 = &StackMemory::getThisContext(this->stack)->field_0;
  pushOop(this,(Oop)*paVar1);
  return;
}

Assistant:

void interpretPushThisContext()
	{
        fetchNextInstructionOpcode();

        // Ensure my frame is married.
        stack->ensureFrameIsMarried();

        pushOop(stack->getThisContext());
	}